

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O3

void __thiscall ipx::Control::Control(Control *this)

{
  Multistream *this_00;
  
  Parameters::Parameters(&this->parameters_);
  this->callback_ = (HighsCallback *)0x0;
  std::ofstream::ofstream(&this->logfile_);
  Timer::Timer(&this->timer_);
  Timer::Timer(&this->interval_);
  Multistream::Multistream(&this->output_);
  this_00 = &this->dummy_;
  Multistream::Multistream(this_00);
  std::ios::clear((int)this_00 + (int)(this_00->super_ostream)._vptr_basic_ostream[-3]);
  return;
}

Assistant:

Control::Control() {
    // When failbit is set, the stream evaluates to false.
    dummy_.setstate(std::ios::failbit);
}